

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall dg::llvmdg::legacy::Function::Function(Function *this)

{
  _Rb_tree_header *p_Var1;
  Block *this_00;
  
  this->firstBlock = (Block *)0x0;
  this_00 = (Block *)operator_new(0x118);
  Block::Block(this_00,(BasicBlock *)0x0,false);
  this->lastBlock = this_00;
  p_Var1 = &(this->blocks)._M_t._M_impl.super__Rb_tree_header;
  (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::_Identity<dg::llvmdg::legacy::Block*>,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>
  ::_M_insert_unique<dg::llvmdg::legacy::Block*const&>
            ((_Rb_tree<dg::llvmdg::legacy::Block*,dg::llvmdg::legacy::Block*,std::_Identity<dg::llvmdg::legacy::Block*>,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>
              *)&this->blocks,&this->lastBlock);
  return;
}

Assistant:

Function::Function() : lastBlock(new Block(nullptr)) {
    blocks.insert(lastBlock);
}